

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O2

void __thiscall
duckdb::BufferPool::SetLimit(BufferPool *this,idx_t limit,char *exception_postscript)

{
  __int_type _Var1;
  string sVar2;
  bool bVar3;
  OutOfMemoryException *pOVar4;
  allocator local_51;
  undefined1 local_50 [32];
  
  ::std::mutex::lock(&this->limit_lock);
  (*this->_vptr_BufferPool[3])(local_50,this,0xb,0,limit,0);
  sVar2 = local_50[0];
  TempBufferPoolReservation::~TempBufferPoolReservation((TempBufferPoolReservation *)(local_50 + 8))
  ;
  if (sVar2 == (string)0x0) {
    pOVar4 = (OutOfMemoryException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_50,
               "Failed to change memory limit to %lld: could not free up enough memory for the new limit%s"
               ,&local_51);
    OutOfMemoryException::OutOfMemoryException<unsigned_long,char_const*>
              (pOVar4,(string *)local_50,limit,exception_postscript);
    __cxa_throw(pOVar4,&OutOfMemoryException::typeinfo,::std::runtime_error::~runtime_error);
  }
  _Var1 = (this->maximum_memory).super___atomic_base<unsigned_long>._M_i;
  LOCK();
  (this->maximum_memory).super___atomic_base<unsigned_long>._M_i = limit;
  UNLOCK();
  (*this->_vptr_BufferPool[3])(local_50,this,0xb,0,limit,0);
  TempBufferPoolReservation::~TempBufferPoolReservation((TempBufferPoolReservation *)(local_50 + 8))
  ;
  if (local_50[0] != (string)0x0) {
    bVar3 = Allocator::SupportsFlush();
    if (bVar3) {
      Allocator::FlushAll();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->limit_lock);
    return;
  }
  LOCK();
  (this->maximum_memory).super___atomic_base<unsigned_long>._M_i = _Var1;
  UNLOCK();
  pOVar4 = (OutOfMemoryException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)local_50,
             "Failed to change memory limit to %lld: could not free up enough memory for the new limit%s"
             ,&local_51);
  OutOfMemoryException::OutOfMemoryException<unsigned_long,char_const*>
            (pOVar4,(string *)local_50,limit,exception_postscript);
  __cxa_throw(pOVar4,&OutOfMemoryException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BufferPool::SetLimit(idx_t limit, const char *exception_postscript) {
	lock_guard<mutex> l_lock(limit_lock);
	// try to evict until the limit is reached
	if (!EvictBlocks(MemoryTag::EXTENSION, 0, limit).success) {
		throw OutOfMemoryException(
		    "Failed to change memory limit to %lld: could not free up enough memory for the new limit%s", limit,
		    exception_postscript);
	}
	idx_t old_limit = maximum_memory;
	// set the global maximum memory to the new limit if successful
	maximum_memory = limit;
	// evict again
	if (!EvictBlocks(MemoryTag::EXTENSION, 0, limit).success) {
		// failed: go back to old limit
		maximum_memory = old_limit;
		throw OutOfMemoryException(
		    "Failed to change memory limit to %lld: could not free up enough memory for the new limit%s", limit,
		    exception_postscript);
	}
	if (Allocator::SupportsFlush()) {
		Allocator::FlushAll();
	}
}